

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::MapBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pBuffer,MAP_TYPE MapType,
          MAP_FLAGS MapFlags,PVoid *pMappedData)

{
  Uint32 *pUVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  iterator iVar4;
  mapped_type *pmVar5;
  undefined7 in_register_00000011;
  char (*Args_2) [26];
  string msg;
  string local_60;
  uint local_3c;
  IBuffer *local_38;
  char (*Args) [9];
  
  Args_2 = (char (*) [26])pMappedData;
  local_38 = pBuffer;
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[25]>(&local_60,(char (*) [25])0x7eaa27);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6e8);
    std::__cxx11::string::~string((string *)&local_60);
  }
  local_3c = (uint)CONCAT71(in_register_00000011,MapType);
  iVar3 = (*(local_38->super_IDeviceObject).super_IObject._vptr_IObject[4])(local_38);
  Args = (char (*) [9])CONCAT44(extraout_var,iVar3);
  iVar4 = std::
          _Hashtable<Diligent::IBuffer_*,_std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IBuffer_*>,_std::hash<Diligent::IBuffer_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_DbgMappedBuffers)._M_h,&local_38);
  if (iVar4.
      super__Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
      ._M_cur != (__node_type *)0x0) {
    FormatString<char[9],char_const*,char[26]>
              (&local_60,(Diligent *)0x6f3938,Args,(char **)"\' has already been mapped",Args_2);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ee);
    std::__cxx11::string::~string((string *)&local_60);
  }
  pmVar5 = std::__detail::
           _Map_base<Diligent::IBuffer_*,_std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IBuffer_*>,_std::hash<Diligent::IBuffer_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Diligent::IBuffer_*,_std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IBuffer_*>,_std::hash<Diligent::IBuffer_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_DbgMappedBuffers,&local_38);
  pmVar5->MapType = (MAP_TYPE)local_3c;
  *pMappedData = (PVoid)0x0;
  if ((MAP_TYPE)local_3c == MAP_READ_WRITE) {
    if (1 < (byte)(Args[2][2] - 3U)) {
      FormatString<char[93]>
                (&local_60,
                 (char (*) [93])
                 "Only buffers with usage USAGE_STAGING or USAGE_UNIFIED can be mapped for reading and writing"
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x705);
      std::__cxx11::string::~string((string *)&local_60);
    }
    bVar2 = Args[2][3];
    if ((bVar2 & 2) == 0) {
      FormatString<char[85]>
                (&local_60,
                 (char (*) [85])
                 "Buffer being mapped for reading & writing was not created with CPU_ACCESS_WRITE flag"
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x706);
      std::__cxx11::string::~string((string *)&local_60);
      bVar2 = Args[2][3];
    }
    if ((bVar2 & 1) == 0) {
      FormatString<char[84]>
                (&local_60,
                 (char (*) [84])
                 "Buffer being mapped for reading & writing was not created with CPU_ACCESS_READ flag"
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x707);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((MapFlags & MAP_FLAG_DISCARD) == MAP_FLAG_NONE) goto LAB_002880a9;
    FormatString<char[74]>
              (&local_60,
               (char (*) [74])
               "MAP_FLAG_DISCARD is not valid when mapping buffer for reading and writing");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x708);
  }
  else if ((local_3c & 0xff) == 2) {
    if (2 < (byte)(Args[2][2] - 2U)) {
      FormatString<char[96]>
                (&local_60,
                 (char (*) [96])
                 "Only buffers with usage USAGE_STAGING, USAGE_DYNAMIC or USAGE_UNIFIED can be mapped for writing"
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6ff);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((Args[2][3] & 2U) != 0) goto LAB_002880a9;
    FormatString<char[75]>
              (&local_60,
               (char (*) [75])
               "Buffer being mapped for writing was not created with CPU_ACCESS_WRITE flag");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x700);
  }
  else if ((local_3c & 0xff) == 1) {
    if (1 < (byte)(Args[2][2] - 3U)) {
      FormatString<char[81]>
                (&local_60,
                 (char (*) [81])
                 "Only buffers with usage USAGE_STAGING or USAGE_UNIFIED can be mapped for reading")
      ;
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6f8);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((Args[2][3] & 1U) == 0) {
      FormatString<char[74]>
                (&local_60,
                 (char (*) [74])
                 "Buffer being mapped for reading was not created with CPU_ACCESS_READ flag");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6f9);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((MapFlags & MAP_FLAG_DISCARD) == MAP_FLAG_NONE) goto LAB_002880a9;
    FormatString<char[62]>
              (&local_60,
               (char (*) [62])"MAP_FLAG_DISCARD is not valid when mapping buffer for reading");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6fa);
  }
  else {
    FormatString<char[17]>(&local_60,(char (*) [17])"Unknown map type");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x70b);
  }
  std::__cxx11::string::~string((string *)&local_60);
LAB_002880a9:
  if (Args[2][2] == '\x02') {
    if ((char)local_3c != '\x02' ||
        (MapFlags & (MAP_FLAG_NO_OVERWRITE|MAP_FLAG_DISCARD)) == MAP_FLAG_NONE) {
      FormatString<char[99]>
                (&local_60,
                 (char (*) [99])
                 "Dynamic buffers can only be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag"
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x710);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((MapFlags & (MAP_FLAG_NO_OVERWRITE|MAP_FLAG_DISCARD)) ==
        (MAP_FLAG_NO_OVERWRITE|MAP_FLAG_DISCARD)) {
      FormatString<char[107]>
                (&local_60,
                 (char (*) [107])
                 "When mapping dynamic buffer, only one of MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flags must be specified"
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x711);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  if ((MapFlags & MAP_FLAG_DISCARD) != MAP_FLAG_NONE) {
    if ((Args[2][2] & 0xfeU) != 2) {
      FormatString<char[65]>
                (&local_60,
                 (char (*) [65])"Only dynamic and staging buffers can be mapped with discard flag");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x716);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((char)local_3c != '\x02') {
      FormatString<char[63]>
                (&local_60,
                 (char (*) [63])"MAP_FLAG_DISCARD is only valid when mapping buffer for writing");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x717);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.MapBuffer;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::MapBuffer(
    IBuffer*  pBuffer,
    MAP_TYPE  MapType,
    MAP_FLAGS MapFlags,
    PVoid&    pMappedData)
{
    DEV_CHECK_ERR(pBuffer, "pBuffer must not be null");

    const BufferDesc& BuffDesc = pBuffer->GetDesc();

#ifdef DILIGENT_DEBUG
    {
        VERIFY(m_DbgMappedBuffers.find(pBuffer) == m_DbgMappedBuffers.end(), "Buffer '", BuffDesc.Name, "' has already been mapped");
        m_DbgMappedBuffers[pBuffer] = DbgMappedBufferInfo{MapType};
    }
#endif

    pMappedData = nullptr;
    switch (MapType)
    {
        case MAP_READ:
            DEV_CHECK_ERR(BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED,
                          "Only buffers with usage USAGE_STAGING or USAGE_UNIFIED can be mapped for reading");
            DEV_CHECK_ERR((BuffDesc.CPUAccessFlags & CPU_ACCESS_READ), "Buffer being mapped for reading was not created with CPU_ACCESS_READ flag");
            DEV_CHECK_ERR((MapFlags & MAP_FLAG_DISCARD) == 0, "MAP_FLAG_DISCARD is not valid when mapping buffer for reading");
            break;

        case MAP_WRITE:
            DEV_CHECK_ERR(BuffDesc.Usage == USAGE_DYNAMIC || BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED,
                          "Only buffers with usage USAGE_STAGING, USAGE_DYNAMIC or USAGE_UNIFIED can be mapped for writing");
            DEV_CHECK_ERR((BuffDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Buffer being mapped for writing was not created with CPU_ACCESS_WRITE flag");
            break;

        case MAP_READ_WRITE:
            DEV_CHECK_ERR(BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED,
                          "Only buffers with usage USAGE_STAGING or USAGE_UNIFIED can be mapped for reading and writing");
            DEV_CHECK_ERR((BuffDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Buffer being mapped for reading & writing was not created with CPU_ACCESS_WRITE flag");
            DEV_CHECK_ERR((BuffDesc.CPUAccessFlags & CPU_ACCESS_READ), "Buffer being mapped for reading & writing was not created with CPU_ACCESS_READ flag");
            DEV_CHECK_ERR((MapFlags & MAP_FLAG_DISCARD) == 0, "MAP_FLAG_DISCARD is not valid when mapping buffer for reading and writing");
            break;

        default: UNEXPECTED("Unknown map type");
    }

    if (BuffDesc.Usage == USAGE_DYNAMIC)
    {
        DEV_CHECK_ERR((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != 0 && MapType == MAP_WRITE, "Dynamic buffers can only be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag");
        DEV_CHECK_ERR((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE), "When mapping dynamic buffer, only one of MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flags must be specified");
    }

    if ((MapFlags & MAP_FLAG_DISCARD) != 0)
    {
        DEV_CHECK_ERR(BuffDesc.Usage == USAGE_DYNAMIC || BuffDesc.Usage == USAGE_STAGING, "Only dynamic and staging buffers can be mapped with discard flag");
        DEV_CHECK_ERR(MapType == MAP_WRITE, "MAP_FLAG_DISCARD is only valid when mapping buffer for writing");
    }

    ++m_Stats.CommandCounters.MapBuffer;
}